

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void __thiscall cubeb_async_logger::run(cubeb_async_logger *this)

{
  anon_class_8_1_8991fb9c_for__M_head_impl local_18;
  thread local_10;
  
  local_18.this = this;
  std::thread::thread<cubeb_async_logger::run()::_lambda()_1_,,void>(&local_10,&local_18);
  std::thread::detach();
  std::thread::~thread(&local_10);
  return;
}

Assistant:

void run()
  {
    std::thread([this]() {
      while (true) {
        cubeb_log_message msg;
        while (msg_queue.dequeue(&msg, 1)) {
          LOGV("%s", msg.get());
        }
#ifdef _WIN32
        Sleep(CUBEB_LOG_BATCH_PRINT_INTERVAL_MS);
#else
        timespec sleep_duration = sleep_for;
        timespec remainder;
        do {
          if (nanosleep(&sleep_duration, &remainder) == 0 ||
              errno != EINTR) {
            break;
          }
          sleep_duration = remainder;
        } while (remainder.tv_sec || remainder.tv_nsec);
#endif
      }
    }).detach();
  }